

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O0

bool __thiscall Firework::display(Firework *this,Screen *screen)

{
  Screen *screen_local;
  Firework *this_local;
  
  if (this->fireworkStage == 0) {
    this_local._7_1_ = false;
  }
  else if (this->fireworkStage == 1) {
    displayStreamer(this,screen);
    this_local._7_1_ = true;
  }
  else if (this->fireworkStage == 2) {
    displayFireworkExplosion(this,screen);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Firework::display(Screen &screen) {
    if(fireworkStage == UNITIALIZED){
        return false;
    }
    else if(fireworkStage == STREAMER_STAGE) {
        displayStreamer(screen);
        return true;
    }
    else if(fireworkStage == EXPLOSION_STAGE){
        displayFireworkExplosion(screen);
        return true;
    }
    else {
        return false;
    }
}